

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzReadFileNames(Byte *data,size_t size,UInt32 numFiles,size_t *offsets)

{
  bool bVar1;
  Byte *local_40;
  Byte *p;
  size_t pos;
  size_t *offsets_local;
  UInt32 numFiles_local;
  size_t size_local;
  Byte *data_local;
  
  p = (Byte *)0x0;
  pos = (size_t)(offsets + 1);
  *offsets = 0;
  if (numFiles == 0) {
    data_local._4_4_ = 0x10;
    if (size == 0) {
      data_local._4_4_ = 0;
    }
  }
  else if (size < 2) {
    data_local._4_4_ = 0x10;
  }
  else if ((data[size - 2] == '\0') && (offsets_local._4_4_ = numFiles, data[size - 1] == '\0')) {
    do {
      if (p == (Byte *)size) {
        return 0x10;
      }
      local_40 = data + (long)p;
      while( true ) {
        bVar1 = true;
        if (*local_40 == '\0') {
          bVar1 = local_40[1] != '\0';
        }
        if (!bVar1) break;
        local_40 = local_40 + 2;
      }
      p = local_40 + (2 - (long)data);
      *(ulong *)pos = (ulong)p >> 1;
      offsets_local._4_4_ = offsets_local._4_4_ - 1;
      pos = pos + 8;
    } while (offsets_local._4_4_ != 0);
    data_local._4_4_ = 0x10;
    if (p == (Byte *)size) {
      data_local._4_4_ = 0;
    }
  }
  else {
    data_local._4_4_ = 0x10;
  }
  return data_local._4_4_;
}

Assistant:

static SRes SzReadFileNames(const Byte *data, size_t size, UInt32 numFiles, size_t *offsets)
{
  size_t pos = 0;
  *offsets++ = 0;
  if (numFiles == 0)
    return (size == 0) ? SZ_OK : SZ_ERROR_ARCHIVE;
  if (size < 2)
    return SZ_ERROR_ARCHIVE;
  if (data[size - 2] != 0 || data[size - 1] != 0)
    return SZ_ERROR_ARCHIVE;
  do
  {
    const Byte *p;
    if (pos == size)
      return SZ_ERROR_ARCHIVE;
    for (p = data + pos;
      #ifdef _WIN32
      *(const UInt16 *)p != 0
      #else
      p[0] != 0 || p[1] != 0
      #endif
      ; p += 2);
    pos = p - data + 2;
    *offsets++ = (pos >> 1);
  }
  while (--numFiles);
  return (pos == size) ? SZ_OK : SZ_ERROR_ARCHIVE;
}